

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format_00;
  TestContext *pTVar1;
  undefined8 uVar2;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  TestNode *node_04;
  TestNode *node_05;
  char *pcVar3;
  Texture2DFormatCase *pTVar4;
  RenderContext *pRVar5;
  char *pcVar6;
  TextureCubeFormatCase *pTVar7;
  Texture2DArrayFormatCase *pTVar8;
  Texture3DFormatCase *pTVar9;
  Texture2DFileCase *pTVar10;
  ContextInfo *pCVar11;
  TextureCubeFileCase *pTVar12;
  void *pvVar13;
  Compressed2DFormatCase *pCVar14;
  CompressedCubeFormatCase *pCVar15;
  int numStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc8;
  undefined1 local_fa1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  undefined1 local_f59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  undefined1 local_f11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  allocator<char> local_ec9;
  undefined1 local_ec8 [8];
  string nameBase_3;
  undefined1 local_ea0 [8];
  string descriptionBase_3;
  int formatNdx_3;
  anon_struct_24_3_eb35bfb1 etc2Formats [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  int local_d1c;
  undefined1 local_d18 [4];
  int face_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  npotFilenames;
  allocator<char> local_cd9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c58;
  int local_c38;
  int local_c34;
  int face;
  int level;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  potFilenames;
  int potNumLevels;
  undefined1 local_bf0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_bd0;
  undefined1 local_bb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  undefined1 local_b69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  undefined1 local_b21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  undefined1 local_ad9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  undefined1 local_a91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  undefined1 local_a49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  allocator<char> local_a01;
  undefined1 local_a00 [8];
  string descriptionBase_2;
  undefined1 local_9d8 [8];
  string nameBase_2;
  int local_9b0;
  deUint32 internalFormat_1;
  int formatNdx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  undefined1 local_961;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  undefined1 local_919;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  undefined1 local_8d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  undefined1 local_889;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  undefined1 local_841;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  undefined1 local_7f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  undefined1 local_7b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  allocator<char> local_769;
  undefined1 local_768 [8];
  string descriptionBase_1;
  undefined1 local_740 [8];
  string nameBase_1;
  deUint32 internalFormat;
  int formatNdx_1;
  anon_struct_16_2_e82303c2 sizedDepthStencilFormats [5];
  anon_struct_16_2_e82303c2 sizedColorFormats [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_369;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined1 local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string descriptionBase;
  undefined1 local_108 [8];
  string nameBase;
  deUint32 dataType;
  deUint32 format;
  int formatNdx;
  anon_struct_16_3_5cb0d78b texFormats [8];
  TestCaseGroup *sized3DGroup;
  TestCaseGroup *sized2DArrayGroup;
  TestCaseGroup *sizedCubeGroup;
  TestCaseGroup *sized2DGroup;
  TestCaseGroup *compressedGroup;
  TestCaseGroup *sizedGroup;
  TestCaseGroup *unsizedGroup;
  TextureFormatTests *this_local;
  TestContext *pTVar16;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unsized",
             "Unsized formats");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sized",
             "Sized formats");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"compressed",
             "Compressed formats");
  tcu::TestNode::addChild((TestNode *)this,node_01);
  texFormats[7].format = 0;
  texFormats[7].dataType = 0;
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "Sized formats (2D)");
  tcu::TestNode::addChild(node_00,node_02);
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Sized formats (Cubemap)");
  tcu::TestNode::addChild(node_00,node_03);
  node_04 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_04,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d_array",
             "Sized formats (2D Array)");
  tcu::TestNode::addChild(node_00,node_04);
  node_05 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_05,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "Sized formats (3D)");
  texFormats[7]._8_8_ = node_05;
  tcu::TestNode::addChild(node_00,node_05);
  memcpy(&format,&DAT_0328b6b0,0x80);
  for (dataType = 0; (int)dataType < 8; dataType = dataType + 1) {
    format_00 = *(deUint32 *)&texFormats[(int)dataType].name;
    nameBase.field_2._12_4_ = *(undefined4 *)((long)&texFormats[(int)dataType].name + 4);
    pcVar3 = *(char **)(&format + (long)(int)dataType * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,pcVar3,
               (allocator<char> *)(descriptionBase.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(format_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,pcVar3,&local_171);
    std::operator+(&local_150,&local_170,", ");
    pcVar3 = glu::getTypeName(nameBase.field_2._12_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   &local_150,pcVar3);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    pTVar4 = (Texture2DFormatCase *)operator_new(0xe8);
    local_1b9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_2d_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar4,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0x80,0x80);
    local_1b9 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    pTVar4 = (Texture2DFormatCase *)operator_new(0xe8);
    local_201 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_1e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_2d_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_200,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar4,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0x3f,0x70);
    local_201 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_249 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_cube_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_248,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0x40,0x40);
    local_249 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_228);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_291 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_270,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_cube_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0x39,0x39);
    local_291 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
    pTVar8 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    local_2d9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_2d_array_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_2D_ARRAY");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar8,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0x40,0x40,8);
    local_2d9 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    pTVar8 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    local_321 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_300,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_2d_array_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_2D_ARRAY");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar8,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0x3f,0x39,7);
    local_321 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    pTVar9 = (Texture3DFormatCase *)operator_new(0xf8);
    local_369 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_3d_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_3D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar9,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,8,0x20,0x10);
    local_369 = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_348);
    pTVar9 = (Texture3DFormatCase *)operator_new(0xf8);
    sizedColorFormats[0x30]._15_1_ = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "_3d_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   ", GL_TEXTURE_3D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar9,pTVar1,pRVar5,pcVar3,pcVar6,format_00,nameBase.field_2._12_4_,0xb,0x1f,7);
    sizedColorFormats[0x30]._15_1_ = 0;
    tcu::TestNode::addChild(node,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)local_108);
  }
  memcpy(&sizedDepthStencilFormats[4].internalFormat,&PTR_anon_var_dwarf_2496f8_0328b730,0x310);
  memcpy(&internalFormat,&PTR_anon_var_dwarf_12b5806_0328ba40,0x50);
  for (nameBase_1.field_2._12_4_ = 0; (int)nameBase_1.field_2._12_4_ < 0x31;
      nameBase_1.field_2._12_4_ = nameBase_1.field_2._12_4_ + 1) {
    nameBase_1.field_2._8_4_ =
         *(undefined4 *)&sizedColorFormats[(int)nameBase_1.field_2._12_4_].name;
    pcVar3 = *(char **)&sizedDepthStencilFormats[(long)(int)nameBase_1.field_2._12_4_ + 4].
                        internalFormat;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_740,pcVar3,
               (allocator<char> *)(descriptionBase_1.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase_1.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(nameBase_1.field_2._8_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_768,pcVar3,&local_769);
    std::allocator<char>::~allocator(&local_769);
    pTVar4 = (Texture2DFormatCase *)operator_new(0xe8);
    local_7b1 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_790,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_7b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar4,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0x80,0x80);
    local_7b1 = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::__cxx11::string::~string((string *)&local_790);
    pTVar4 = (Texture2DFormatCase *)operator_new(0xe8);
    local_7f9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_7d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_7f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar4,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0x3f,0x70);
    local_7f9 = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::__cxx11::string::~string((string *)&local_7d8);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_841 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_820,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0x40,0x40);
    local_841 = 0;
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_820);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_889 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_868,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_888,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0x39,0x39);
    local_889 = 0;
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::~string((string *)&local_868);
    pTVar8 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    local_8d1 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_8b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_8d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_2D_ARRAY");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar8,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0x40,0x40,8);
    local_8d1 = 0;
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::__cxx11::string::~string((string *)&local_8b0);
    pTVar8 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    local_919 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_8f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_918,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_2D_ARRAY");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar8,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0x3f,0x39,7);
    local_919 = 0;
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_918);
    std::__cxx11::string::~string((string *)&local_8f8);
    uVar2 = texFormats[7]._8_8_;
    pTVar9 = (Texture3DFormatCase *)operator_new(0xf8);
    local_961 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_940,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_960,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_3D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar9,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,8,0x20,0x10);
    local_961 = 0;
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_960);
    std::__cxx11::string::~string((string *)&local_940);
    uVar2 = texFormats[7]._8_8_;
    pTVar9 = (Texture3DFormatCase *)operator_new(0xf8);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_988,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&formatNdx_2
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
                   ", GL_TEXTURE_3D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture3DFormatCase::Texture3DFormatCase
              (pTVar9,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_1.field_2._8_4_,0xb,0x1f,7);
    tcu::TestNode::addChild((TestNode *)uVar2,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&formatNdx_2);
    std::__cxx11::string::~string((string *)&local_988);
    std::__cxx11::string::~string((string *)local_768);
    std::__cxx11::string::~string((string *)local_740);
  }
  for (local_9b0 = 0; local_9b0 < 5; local_9b0 = local_9b0 + 1) {
    nameBase_2.field_2._12_4_ = *(undefined4 *)&sizedDepthStencilFormats[local_9b0].name;
    pcVar3 = *(char **)(&internalFormat + (long)local_9b0 * 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_9d8,pcVar3,
               (allocator<char> *)(descriptionBase_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(descriptionBase_2.field_2._M_local_buf + 0xf));
    pcVar3 = glu::getTextureFormatName(nameBase_2.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a00,pcVar3,&local_a01);
    std::allocator<char>::~allocator(&local_a01);
    pTVar4 = (Texture2DFormatCase *)operator_new(0xe8);
    local_a49 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_a28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_a48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar4,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_2.field_2._12_4_,0x80,0x80);
    local_a49 = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_a48);
    std::__cxx11::string::~string((string *)&local_a28);
    pTVar4 = (Texture2DFormatCase *)operator_new(0xe8);
    local_a91 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_a70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_a90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DFormatCase::Texture2DFormatCase
              (pTVar4,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_2.field_2._12_4_,0x3f,0x70);
    local_a91 = 0;
    tcu::TestNode::addChild(node_02,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_a90);
    std::__cxx11::string::~string((string *)&local_a70);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_ad9 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_ab8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_ad8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_2.field_2._12_4_,0x40,0x40);
    local_ad9 = 0;
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_ad8);
    std::__cxx11::string::~string((string *)&local_ab8);
    pTVar7 = (TextureCubeFormatCase *)operator_new(0xf0);
    local_b21 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_b00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_b20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    TextureCubeFormatCase::TextureCubeFormatCase
              (pTVar7,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_2.field_2._12_4_,0x39,0x39);
    local_b21 = 0;
    tcu::TestNode::addChild(node_03,(TestNode *)pTVar7);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_b00);
    pTVar8 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    local_b69 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_b48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_b68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00,
                   ", GL_TEXTURE_2D_ARRAY");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar8,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_2.field_2._12_4_,0x40,0x40,8);
    local_b69 = 0;
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_b68);
    std::__cxx11::string::~string((string *)&local_b48);
    pTVar8 = (Texture2DArrayFormatCase *)operator_new(0xf8);
    local_bb1 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    std::operator+(&local_b90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8,
                   "_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_bb0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00,
                   ", GL_TEXTURE_2D_ARRAY");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Texture2DArrayFormatCase::Texture2DArrayFormatCase
              (pTVar8,pTVar1,pRVar5,pcVar3,pcVar6,nameBase_2.field_2._12_4_,0x3f,0x39,7);
    local_bb1 = 0;
    tcu::TestNode::addChild(node_04,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&local_bb0);
    std::__cxx11::string::~string((string *)&local_b90);
    std::__cxx11::string::~string((string *)local_a00);
    std::__cxx11::string::~string((string *)local_9d8);
  }
  pTVar10 = (Texture2DFileCase *)operator_new(0xf8);
  filenames_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pTVar16 = pTVar1;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  numStr = (int)pTVar16;
  pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  toStringVector_abi_cxx11_(&local_bd0,(Functional *)init::filenames,(char **)0x8,numStr);
  Texture2DFileCase::Texture2DFileCase
            (pTVar10,pTVar1,pRVar5,pCVar11,"etc1_2d_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             &local_bd0);
  filenames_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_bd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_bf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&potNumLevels,"data/etc1/photo_helsinki_113x89.pkm",
             (allocator<char> *)
             ((long)&potFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_bf0,(value_type *)&potNumLevels);
  std::__cxx11::string::~string((string *)&potNumLevels);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&potFilenames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pTVar10 = (Texture2DFileCase *)operator_new(0xf8);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  Texture2DFileCase::Texture2DFileCase
            (pTVar10,pTVar1,pRVar5,pCVar11,"etc1_2d_npot","GL_ETC1_RGB8_OES, GL_TEXTURE_2D",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_bf0);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_bf0);
  potFilenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 7;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&face);
  for (local_c34 = 0; local_c34 < 7; local_c34 = local_c34 + 1) {
    for (local_c38 = 0; local_c38 < 6; local_c38 = local_c38 + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cd8,"data/etc1/skybox_",&local_cd9);
      std::operator+(&local_cb8,&local_cd8,init::faceExt[local_c38]);
      std::operator+(&local_c98,&local_cb8,"_mip_");
      de::toString<int>((string *)
                        &npotFilenames.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c34);
      std::operator+(&local_c78,&local_c98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &npotFilenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_c58,&local_c78,".pkm");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&face,&local_c58);
      std::__cxx11::string::~string((string *)&local_c58);
      std::__cxx11::string::~string((string *)&local_c78);
      std::__cxx11::string::~string
                ((string *)
                 &npotFilenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&local_c98);
      std::__cxx11::string::~string((string *)&local_cb8);
      std::__cxx11::string::~string((string *)&local_cd8);
      std::allocator<char>::~allocator(&local_cd9);
    }
  }
  pTVar12 = (TextureCubeFileCase *)operator_new(0x100);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  TextureCubeFileCase::TextureCubeFileCase
            (pTVar12,pTVar1,pRVar5,pCVar11,"etc1_cube_pot","GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&face);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d18);
  for (local_d1c = 0; local_d1c < 6; local_d1c = local_d1c + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d80,"data/etc1/skybox_61x61_",
               (allocator<char> *)&etc2Formats[9].field_0x17);
    std::operator+(&local_d60,&local_d80,init::faceExt[local_d1c]);
    std::operator+(&local_d40,&local_d60,".pkm");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d18,&local_d40);
    std::__cxx11::string::~string((string *)&local_d40);
    std::__cxx11::string::~string((string *)&local_d60);
    std::__cxx11::string::~string((string *)&local_d80);
    std::allocator<char>::~allocator((allocator<char> *)&etc2Formats[9].field_0x17);
  }
  pTVar12 = (TextureCubeFileCase *)operator_new(0x100);
  pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  TextureCubeFileCase::TextureCubeFileCase
            (pTVar12,pTVar1,pRVar5,pCVar11,"etc1_cube_npot","GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP",
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_d18);
  tcu::TestNode::addChild(node_01,(TestNode *)pTVar12);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&face);
  pvVar13 = memcpy(&stack0xfffffffffffff188,&PTR_anon_var_dwarf_2f8f93_0328ba90,0xf0);
  descriptionBase_3.field_2._12_4_ = 0;
  while ((int)descriptionBase_3.field_2._12_4_ < 10) {
    pcVar3 = *(char **)(&stack0xfffffffffffff188 +
                       (long)(int)descriptionBase_3.field_2._12_4_ * 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_ea0,pcVar3,(allocator<char> *)(nameBase_3.field_2._M_local_buf + 0xf)
              );
    std::allocator<char>::~allocator((allocator<char> *)(nameBase_3.field_2._M_local_buf + 0xf));
    pcVar3 = etc2Formats[(int)descriptionBase_3.field_2._12_4_].descriptionBase;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_ec8,pcVar3,&local_ec9);
    std::allocator<char>::~allocator(&local_ec9);
    pCVar14 = (Compressed2DFormatCase *)operator_new(0xf0);
    local_f11 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_ef0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8,
                   "_2d_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_f10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea0,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Compressed2DFormatCase::Compressed2DFormatCase
              (pCVar14,pTVar1,pRVar5,pCVar11,pcVar3,pcVar6,
               *(CompressedTexFormat *)&etc2Formats[(int)descriptionBase_3.field_2._12_4_].nameBase,
               1,0x80,0x40);
    local_f11 = 0;
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar14);
    std::__cxx11::string::~string((string *)&local_f10);
    std::__cxx11::string::~string((string *)&local_ef0);
    pCVar15 = (CompressedCubeFormatCase *)operator_new(0xf8);
    local_f59 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_f38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8,
                   "_cube_pot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_f58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea0,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    CompressedCubeFormatCase::CompressedCubeFormatCase
              (pCVar15,pTVar1,pRVar5,pCVar11,pcVar3,pcVar6,
               *(CompressedTexFormat *)&etc2Formats[(int)descriptionBase_3.field_2._12_4_].nameBase,
               1,0x40,0x40);
    local_f59 = 0;
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar15);
    std::__cxx11::string::~string((string *)&local_f58);
    std::__cxx11::string::~string((string *)&local_f38);
    pCVar14 = (Compressed2DFormatCase *)operator_new(0xf0);
    local_fa1 = 1;
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_f80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8,
                   "_2d_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_fa0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea0,
                   ", GL_TEXTURE_2D");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Compressed2DFormatCase::Compressed2DFormatCase
              (pCVar14,pTVar1,pRVar5,pCVar11,pcVar3,pcVar6,
               *(CompressedTexFormat *)&etc2Formats[(int)descriptionBase_3.field_2._12_4_].nameBase,
               1,0x33,0x41);
    local_fa1 = 0;
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar14);
    std::__cxx11::string::~string((string *)&local_fa0);
    std::__cxx11::string::~string((string *)&local_f80);
    pCVar15 = (CompressedCubeFormatCase *)operator_new(0xf8);
    pTVar1 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pCVar11 = gles3::Context::getContextInfo((this->super_TestCaseGroup).m_context);
    std::operator+(&local_fc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ec8,
                   "_cube_npot");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::operator+(&local_fe8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ea0,
                   ", GL_TEXTURE_CUBE_MAP");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    CompressedCubeFormatCase::CompressedCubeFormatCase
              (pCVar15,pTVar1,pRVar5,pCVar11,pcVar3,pcVar6,
               *(CompressedTexFormat *)&etc2Formats[(int)descriptionBase_3.field_2._12_4_].nameBase,
               1,0x33,0x33);
    tcu::TestNode::addChild(node_01,(TestNode *)pCVar15);
    std::__cxx11::string::~string((string *)&local_fe8);
    std::__cxx11::string::~string((string *)&local_fc8);
    std::__cxx11::string::~string((string *)local_ec8);
    std::__cxx11::string::~string((string *)local_ea0);
    descriptionBase_3.field_2._12_4_ = descriptionBase_3.field_2._12_4_ + 1;
    pvVar13 = (void *)(ulong)(uint)descriptionBase_3.field_2._12_4_;
  }
  return (int)pvVar13;
}

Assistant:

void TextureFormatTests::init (void)
{
	tcu::TestCaseGroup* unsizedGroup	= DE_NULL;
	tcu::TestCaseGroup*	sizedGroup		= DE_NULL;
	tcu::TestCaseGroup* compressedGroup	= DE_NULL;
	addChild((unsizedGroup		= new tcu::TestCaseGroup(m_testCtx, "unsized",		"Unsized formats")));
	addChild((sizedGroup		= new tcu::TestCaseGroup(m_testCtx, "sized",		"Sized formats")));
	addChild((compressedGroup	= new tcu::TestCaseGroup(m_testCtx, "compressed",	"Compressed formats")));

	tcu::TestCaseGroup*	sized2DGroup		= DE_NULL;
	tcu::TestCaseGroup*	sizedCubeGroup		= DE_NULL;
	tcu::TestCaseGroup*	sized2DArrayGroup	= DE_NULL;
	tcu::TestCaseGroup*	sized3DGroup		= DE_NULL;
	sizedGroup->addChild((sized2DGroup			= new tcu::TestCaseGroup(m_testCtx, "2d",			"Sized formats (2D)")));
	sizedGroup->addChild((sizedCubeGroup		= new tcu::TestCaseGroup(m_testCtx, "cube",			"Sized formats (Cubemap)")));
	sizedGroup->addChild((sized2DArrayGroup		= new tcu::TestCaseGroup(m_testCtx, "2d_array",		"Sized formats (2D Array)")));
	sizedGroup->addChild((sized3DGroup			= new tcu::TestCaseGroup(m_testCtx, "3d",			"Sized formats (3D)")));

	struct
	{
		const char*	name;
		deUint32		format;
		deUint32		dataType;
	} texFormats[] =
	{
		{ "alpha",							GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance",						GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance_alpha",				GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_unsigned_short_5_6_5",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb_unsigned_byte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_unsigned_short_4_4_4_4",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_unsigned_short_5_5_5_1",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba_unsigned_byte",				GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		unsizedGroup->addChild(new Texture2DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_pot").c_str(),			(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType, 128, 128));
		unsizedGroup->addChild(new Texture2DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			format, dataType,  63, 112));
		unsizedGroup->addChild(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  64,  64));
		unsizedGroup->addChild(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_cube_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	format, dataType,  57,  57));
		unsizedGroup->addChild(new Texture2DArrayFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_array_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	format, dataType,  64,  64,  8));
		unsizedGroup->addChild(new Texture2DArrayFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_2d_array_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	format, dataType,  63,  57,  7));
		unsizedGroup->addChild(new Texture3DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_3d_pot").c_str(),			(descriptionBase + ", GL_TEXTURE_3D").c_str(),			format, dataType,   8,  32, 16));
		unsizedGroup->addChild(new Texture3DFormatCase			(m_testCtx, m_context.getRenderContext(),	(nameBase + "_3d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_3D").c_str(),			format, dataType,  11,  31,  7));
	}

	struct
	{
		const char*	name;
		deUint32		internalFormat;
	} sizedColorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	struct
	{
		const char*	name;
		deUint32		internalFormat;
	} sizedDepthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedColorFormats[formatNdx].internalFormat;
		string	nameBase		= sizedColorFormats[formatNdx].name;
		string	descriptionBase	= glu::getTextureFormatName(internalFormat);

		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat, 128, 128));
		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat,  63, 112));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  64,  64));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  57,  57));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  64,  64,  8));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  63,  57,  7));
		sized3DGroup->addChild		(new Texture3DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_3D").c_str(),			internalFormat,   8,  32, 16));
		sized3DGroup->addChild		(new Texture3DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_3D").c_str(),			internalFormat,  11,  31,  7));
	}

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedDepthStencilFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedDepthStencilFormats[formatNdx].internalFormat;
		string	nameBase		= sizedDepthStencilFormats[formatNdx].name;
		string	descriptionBase	= glu::getTextureFormatName(internalFormat);

		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat, 128, 128));
		sized2DGroup->addChild		(new Texture2DFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D").c_str(),			internalFormat,  63, 112));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  64,  64));
		sizedCubeGroup->addChild	(new TextureCubeFormatCase		(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	internalFormat,  57,  57));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  64,  64,  8));
		sized2DArrayGroup->addChild	(new Texture2DArrayFormatCase	(m_testCtx, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_2D_ARRAY").c_str(),	internalFormat,  63,  57,  7));
	}

	// ETC-1 compressed formats.
	{
		static const char* filenames[] =
		{
			"data/etc1/photo_helsinki_mip_0.pkm",
			"data/etc1/photo_helsinki_mip_1.pkm",
			"data/etc1/photo_helsinki_mip_2.pkm",
			"data/etc1/photo_helsinki_mip_3.pkm",
			"data/etc1/photo_helsinki_mip_4.pkm",
			"data/etc1/photo_helsinki_mip_5.pkm",
			"data/etc1/photo_helsinki_mip_6.pkm",
			"data/etc1/photo_helsinki_mip_7.pkm"
		};
		compressedGroup->addChild(new Texture2DFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", toStringVector(filenames, DE_LENGTH_OF_ARRAY(filenames))));
	}

	{
		vector<string> filenames;
		filenames.push_back("data/etc1/photo_helsinki_113x89.pkm");
		compressedGroup->addChild(new Texture2DFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_2d_npot", "GL_ETC1_RGB8_OES, GL_TEXTURE_2D", filenames));
	}

	{
		static const char* faceExt[] = { "neg_x", "pos_x", "neg_y", "pos_y", "neg_z", "pos_z" };

		const int		potNumLevels	= 7;
		vector<string>	potFilenames;
		for (int level = 0; level < potNumLevels; level++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				potFilenames.push_back(string("data/etc1/skybox_") + faceExt[face] + "_mip_" + de::toString(level) + ".pkm");

		compressedGroup->addChild(new TextureCubeFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_pot", "GL_ETC1_RGB8_OES, GL_TEXTURE_CUBE_MAP", potFilenames));

		vector<string> npotFilenames;
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			npotFilenames.push_back(string("data/etc1/skybox_61x61_") + faceExt[face] + ".pkm");

		compressedGroup->addChild(new TextureCubeFileCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), "etc1_cube_npot", "GL_ETC_RGB8_OES, GL_TEXTURE_CUBE_MAP", npotFilenames));
	}

	// ETC-2 and EAC compressed formats.
	struct {
		const char*					descriptionBase;
		const char*					nameBase;
		tcu::CompressedTexFormat	format;
	} etc2Formats[] =
	{
		{ "GL_COMPRESSED_R11_EAC",							"eac_r11",							tcu::COMPRESSEDTEXFORMAT_EAC_R11,							},
		{ "GL_COMPRESSED_SIGNED_R11_EAC",					"eac_signed_r11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11,					},
		{ "GL_COMPRESSED_RG11_EAC",							"eac_rg11",							tcu::COMPRESSEDTEXFORMAT_EAC_RG11,							},
		{ "GL_COMPRESSED_SIGNED_RG11_EAC",					"eac_signed_rg11",					tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11,					},
		{ "GL_COMPRESSED_RGB8_ETC2",						"etc2_rgb8",						tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8,							},
		{ "GL_COMPRESSED_SRGB8_ETC2",						"etc2_srgb8",						tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8,						},
		{ "GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2",	"etc2_rgb8_punchthrough_alpha1",	tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1,		},
		{ "GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2",	"etc2_srgb8_punchthrough_alpha1",	tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1,	},
		{ "GL_COMPRESSED_RGBA8_ETC2_EAC",					"etc2_eac_rgba8",					tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8,					},
		{ "GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC",			"etc2_eac_srgb8_alpha8",			tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8,				}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		string descriptionBase	= etc2Formats[formatNdx].descriptionBase;
		string nameBase			= etc2Formats[formatNdx].nameBase;

		compressedGroup->addChild(new Compressed2DFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_2d_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			etc2Formats[formatNdx].format,	1,	128,	64));
		compressedGroup->addChild(new CompressedCubeFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	etc2Formats[formatNdx].format,	1,	64,		64));
		compressedGroup->addChild(new Compressed2DFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_2d_npot").c_str(),		(descriptionBase + ", GL_TEXTURE_2D").c_str(),			etc2Formats[formatNdx].format,	1,	51,		65));
		compressedGroup->addChild(new CompressedCubeFormatCase	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP").c_str(),	etc2Formats[formatNdx].format,	1,	51,		51));
	}


}